

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O2

void __thiscall
Fixpp::impl::
MessageVisitor<should_visit_logon_frame::Visitor,DefaultTestRules<Fixpp::v42::Spec::Dictionary>>::
handleUnknownTag<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)89>,Fixpp::Required<Fixpp::TagT<262u,Fixpp::Type::String>>,Fixpp::TagT<281u,Fixpp::Type::Char>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>>,Fixpp::TypedParsingContext<void>>
          (undefined8 param_1,Token *valueToken,long message,undefined8 param_4,int tag)

{
  pair<const_char_*,_unsigned_long> local_30;
  int local_1c [2];
  int tag_local;
  
  local_1c[0] = tag;
  local_30 = StreamCursor::Token::view(valueToken);
  llvm::
  SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,Fixpp::Required<Fixpp::TagT<262u,Fixpp::Type::String>>,Fixpp::TagT<281u,Fixpp::Type::Char>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>>::Unparsed>
  ::emplace_back<int&,std::pair<char_const*,unsigned_long>>
            ((SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,Fixpp::Required<Fixpp::TagT<262u,Fixpp::Type::String>>,Fixpp::TagT<281u,Fixpp::Type::Char>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>>::Unparsed>
              *)(message + 0x60),local_1c,&local_30);
  return;
}

Assistant:

void handleUnknownTag(const StreamCursor::Token& valueToken, Message& message, Context& /*context*/, int tag,
                                  BoolPack<false, false>)
            {
                message.unparsed.emplace_back(tag, valueToken.view());
            }